

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMultiProcessHandler::CheckCycles(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  mapped_type *pmVar2;
  mapped_type *ppcVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar10;
  int root;
  int test;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  ostringstream cmCTestLog_msg;
  _Rb_tree_color local_280;
  _Rb_tree_color local_27c;
  _Deque_base<int,_std::allocator<int>_> local_278;
  _Rb_tree_color local_220;
  _Rb_tree_color local_21c;
  _Base_ptr local_218;
  _Base_ptr local_210;
  TestMap *local_208;
  PropertiesMap *local_200;
  long *local_1f8;
  long local_1e8 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1d8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Checking test dependency graph...",0x21);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x4a9,(char *)local_278._M_impl.super__Deque_impl_data._M_map,this->Quiet);
  if ((iterator *)local_278._M_impl.super__Deque_impl_data._M_map !=
      &local_278._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(local_278._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)local_278._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  p_Var5 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_218 = &(this->Tests).
               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar7 = p_Var5 == local_218;
  if (bVar7) {
LAB_001da142:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Checking test dependency graph end",0x22);
    std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x4c6,(char *)local_278._M_impl.super__Deque_impl_data._M_map,this->Quiet);
    if ((iterator *)local_278._M_impl.super__Deque_impl_data._M_map !=
        &local_278._M_impl.super__Deque_impl_data._M_start) {
      operator_delete(local_278._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)local_278._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return bVar7;
  }
  local_208 = &this->Tests;
  local_200 = &this->Properties;
  do {
    local_280 = p_Var5[1]._M_color;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1d8._M_impl.super__Rb_tree_header._M_header;
    local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_278._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_278._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_210 = p_Var5;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_278,0);
    if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&local_278,(int *)&local_280);
    }
    else {
      *local_278._M_impl.super__Deque_impl_data._M_finish._M_cur = local_280;
      local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
LAB_001d9eda:
    bVar8 = local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_278._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (!bVar8) {
      if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_278._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_27c = local_278._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
        operator_delete(local_278._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_278._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_278._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_278._M_impl.super__Deque_impl_data._M_finish._M_last =
             (_Elt_pointer)
             ((_Rb_tree_color *)local_278._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80);
        local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             ((_Rb_tree_color *)local_278._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f);
        local_278._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_278._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_27c = local_278._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pVar10 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
               _M_insert_unique<int_const&>
                         ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                           *)&local_1d8,(int *)&local_27c);
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pmVar2 = std::
                 map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                 ::operator[](&local_208->
                               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                              ,(key_type *)&local_27c);
        for (p_Var5 = (pmVar2->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            bVar9 = (_Rb_tree_header *)p_Var5 !=
                    &(pmVar2->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                     super__Rb_tree_header, bVar9;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          _Var6 = p_Var5[1]._M_color;
          local_21c = local_280;
          if (_Var6 == local_280) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Error: a cycle exists in the test dependency graph for the test \"",0x41);
            ppcVar3 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&local_200->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)&local_280);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,((*ppcVar3)->Name)._M_dataplus._M_p,
                                ((*ppcVar3)->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"\".\nPlease fix the cycle and run ctest again.\n",0x2d);
            pcVar1 = this->CTest;
            local_220 = _Var6;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x4bc,(char *)local_1f8,false);
            if (local_1f8 != local_1e8) {
              operator_delete(local_1f8,local_1e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            _Var6 = local_220;
          }
          else if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_278,(int *)(p_Var5 + 1));
          }
          else {
            *local_278._M_impl.super__Deque_impl_data._M_finish._M_cur = _Var6;
            local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          if (_Var6 == local_21c) {
            if (bVar9) {
              std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_278);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree(&local_1d8);
              if (bVar8) goto LAB_001da12a;
              if (bVar7 == false) {
                return false;
              }
              goto LAB_001da142;
            }
            break;
          }
        }
      }
      goto LAB_001d9eda;
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_278);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1d8);
LAB_001da12a:
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_210);
    bVar7 = p_Var5 == local_218;
    if (bVar7) goto LAB_001da142;
  } while( true );
}

Assistant:

bool cmCTestMultiProcessHandler::CheckCycles()
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph..." << std::endl,
                     this->Quiet);
  for (auto const& it : this->Tests) {
    // DFS from each element to itself
    int root = it.first;
    std::set<int> visited;
    std::stack<int> s;
    s.push(root);
    while (!s.empty()) {
      int test = s.top();
      s.pop();
      if (visited.insert(test).second) {
        for (auto const& d : this->Tests[test]) {
          if (d == root) {
            // cycle exists
            cmCTestLog(
              this->CTest, ERROR_MESSAGE,
              "Error: a cycle exists in the test dependency graph "
              "for the test \""
                << this->Properties[root]->Name
                << "\".\nPlease fix the cycle and run ctest again.\n");
            return false;
          }
          s.push(d);
        }
      }
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph end" << std::endl,
                     this->Quiet);
  return true;
}